

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

void Curl_update_timer(Curl_multi *multi)

{
  Curl_tree *pCVar1;
  undefined4 uVar2;
  int iVar3;
  undefined4 uVar4;
  long in_RAX;
  long timeout_ms;
  
  if (multi->timer_cb == (curl_multi_timer_callback)0x0) {
    return;
  }
  timeout_ms = in_RAX;
  multi_timeout(multi,&timeout_ms);
  if (timeout_ms < 0) {
    if (((multi->timer_lastcall).tv_sec == 0) && ((multi->timer_lastcall).tv_usec == 0)) {
      return;
    }
    (multi->timer_lastcall).tv_sec = 0;
    *(undefined8 *)&(multi->timer_lastcall).tv_usec = 0;
    timeout_ms = -1;
  }
  else {
    pCVar1 = multi->timetree;
    if (((pCVar1->key).tv_sec == (multi->timer_lastcall).tv_sec) &&
       ((pCVar1->key).tv_usec == (multi->timer_lastcall).tv_usec)) {
      return;
    }
    uVar2 = *(undefined4 *)((long)&(pCVar1->key).tv_sec + 4);
    iVar3 = (pCVar1->key).tv_usec;
    uVar4 = *(undefined4 *)&(pCVar1->key).field_0xc;
    *(int *)&(multi->timer_lastcall).tv_sec = (int)(pCVar1->key).tv_sec;
    *(undefined4 *)((long)&(multi->timer_lastcall).tv_sec + 4) = uVar2;
    (multi->timer_lastcall).tv_usec = iVar3;
    *(undefined4 *)&(multi->timer_lastcall).field_0xc = uVar4;
  }
  (*multi->timer_cb)(multi,timeout_ms,multi->timer_userp);
  return;
}

Assistant:

void Curl_update_timer(struct Curl_multi *multi)
{
  long timeout_ms;

  if(!multi->timer_cb)
    return;
  if(multi_timeout(multi, &timeout_ms)) {
    return;
  }
  if(timeout_ms < 0) {
    static const struct curltime none = {0, 0};
    if(Curl_splaycomparekeys(none, multi->timer_lastcall)) {
      multi->timer_lastcall = none;
      /* there's no timeout now but there was one previously, tell the app to
         disable it */
      multi->timer_cb(multi, -1, multi->timer_userp);
      return;
    }
    return;
  }

  /* When multi_timeout() is done, multi->timetree points to the node with the
   * timeout we got the (relative) time-out time for. We can thus easily check
   * if this is the same (fixed) time as we got in a previous call and then
   * avoid calling the callback again. */
  if(Curl_splaycomparekeys(multi->timetree->key, multi->timer_lastcall) == 0)
    return;

  multi->timer_lastcall = multi->timetree->key;

  multi->timer_cb(multi, timeout_ms, multi->timer_userp);
}